

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall
QXmlStreamWriterPrivate::writeStartElement
          (QXmlStreamWriterPrivate *this,QAnyStringView namespaceUri,QAnyStringView name,
          StartElementOption option)

{
  Tag *pTVar1;
  qsizetype *pqVar2;
  long lVar3;
  ulong uVar4;
  QString *pQVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  qsizetype qVar9;
  bool bVar10;
  Tag *__ptr;
  long lVar11;
  NamespaceDeclaration *pNVar12;
  char16_t *pcVar13;
  long lVar14;
  size_t __n;
  void *pvVar15;
  int iVar16;
  long in_FS_OFFSET;
  XmlStringRef local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar10 = finishStartElement(this,false);
  if ((!bVar10) && ((this->field_0x78 & 0x80) != 0)) {
    indent(this,(int)(this->super_QXmlStreamPrivateTagStack).tagStack.tos + 1);
  }
  __ptr = (this->super_QXmlStreamPrivateTagStack).tagStack.data;
  lVar14 = (this->super_QXmlStreamPrivateTagStack).tagStack.tos;
  lVar11 = lVar14 + 1;
  lVar3 = (this->super_QXmlStreamPrivateTagStack).tagStack.cap;
  if (lVar3 <= lVar11) {
    lVar14 = lVar14 + 2;
    lVar11 = lVar3 * 2;
    if (lVar14 != lVar11 && SBORROW8(lVar14,lVar11) == lVar14 + lVar3 * -2 < 0) {
      lVar11 = lVar14;
    }
    (this->super_QXmlStreamPrivateTagStack).tagStack.cap = lVar11;
    __ptr = (Tag *)realloc(__ptr,lVar11 * 0x70);
    (this->super_QXmlStreamPrivateTagStack).tagStack.data = __ptr;
    if (__ptr == (Tag *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
      goto LAB_003994a8;
    }
    lVar11 = (this->super_QXmlStreamPrivateTagStack).tagStack.tos + 1;
  }
  (this->super_QXmlStreamPrivateTagStack).tagStack.tos = lVar11;
  pTVar1 = __ptr + lVar11;
  pqVar2 = &__ptr[lVar11].namespaceDeclaration.namespaceUri.m_pos;
  *pqVar2 = 0;
  pqVar2[1] = 0;
  pqVar2 = &__ptr[lVar11].namespaceDeclaration.prefix.m_size;
  *pqVar2 = 0;
  pqVar2[1] = 0;
  __ptr[lVar11].namespaceDeclaration.prefix.m_string = (QString *)0x0;
  __ptr[lVar11].namespaceDeclaration.prefix.m_pos = 0;
  pqVar2 = &__ptr[lVar11].qualifiedName.m_pos;
  *pqVar2 = 0;
  pqVar2[1] = 0;
  pqVar2 = &__ptr[lVar11].name.m_size;
  *pqVar2 = 0;
  pqVar2[1] = 0;
  __ptr[lVar11].name.m_string = (QString *)0x0;
  __ptr[lVar11].name.m_pos = 0;
  __ptr[lVar11].tagStackStringStorageSize =
       (this->super_QXmlStreamPrivateTagStack).tagStackStringStorageSize;
  __ptr[lVar11].namespaceDeclarationsSize =
       (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos + 1;
  QXmlStreamPrivateTagStack::addToStringStorage
            (&local_50,&this->super_QXmlStreamPrivateTagStack,name);
  __ptr[lVar11].name.m_size = local_50.m_size;
  __ptr[lVar11].name.m_string = local_50.m_string;
  __ptr[lVar11].name.m_pos = local_50.m_pos;
  __n = 0;
  pNVar12 = findNamespace(this,namespaceUri,false,false);
  qVar6 = (pNVar12->prefix).m_pos;
  qVar7 = (pNVar12->prefix).m_size;
  pQVar5 = (pNVar12->namespaceUri).m_string;
  qVar8 = (pNVar12->namespaceUri).m_pos;
  qVar9 = (pNVar12->namespaceUri).m_size;
  __ptr[lVar11].namespaceDeclaration.prefix.m_string = (pNVar12->prefix).m_string;
  __ptr[lVar11].namespaceDeclaration.prefix.m_pos = qVar6;
  pqVar2 = &__ptr[lVar11].namespaceDeclaration.prefix.m_size;
  *pqVar2 = qVar7;
  pqVar2[1] = (qsizetype)pQVar5;
  pqVar2 = &__ptr[lVar11].namespaceDeclaration.namespaceUri.m_pos;
  *pqVar2 = qVar8;
  pqVar2[1] = qVar9;
  write(this,0x5a5e49,(void *)0x1,__n);
  uVar4 = __ptr[lVar11].namespaceDeclaration.prefix.m_size;
  if (uVar4 != 0) {
    pQVar5 = __ptr[lVar11].namespaceDeclaration.prefix.m_string;
    if (pQVar5 == (QString *)0x0) {
      iVar16 = 0;
      pvVar15 = (void *)0x8000000000000000;
    }
    else {
      pcVar13 = (pQVar5->d).ptr;
      if (pcVar13 == (char16_t *)0x0) {
        pcVar13 = &QString::_empty;
      }
      __n = (pTVar1->namespaceDeclaration).prefix.m_pos;
      iVar16 = (int)pcVar13 + (int)__n * 2;
      pvVar15 = (void *)(uVar4 | 0x8000000000000000);
    }
    write(this,iVar16,pvVar15,__n);
    write(this,0x4d6a9c,(void *)0x1,__n);
  }
  pQVar5 = (pTVar1->name).m_string;
  if (pQVar5 == (QString *)0x0) {
    iVar16 = 0;
  }
  else {
    pcVar13 = (pQVar5->d).ptr;
    if (pcVar13 == (char16_t *)0x0) {
      pcVar13 = &QString::_empty;
    }
    iVar16 = (int)pcVar13 + (int)(pTVar1->name).m_pos * 2;
  }
  pvVar15 = (void *)((pTVar1->name).m_size | 0x8000000000000000);
  if (pQVar5 == (QString *)0x0) {
    pvVar15 = (void *)0x8000000000000000;
  }
  write(this,iVar16,pvVar15,0x8000000000000000);
  this->field_0x78 = this->field_0x78 | 10;
  if ((option != OmitNamespaceDeclarations) &&
     (lVar11 = this->lastNamespaceDeclaration,
     lVar11 <= (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos)) {
    lVar14 = lVar11 + -1;
    lVar11 = lVar11 * 0x30;
    do {
      writeNamespaceDeclaration
                (this,(NamespaceDeclaration *)
                      ((long)&(((this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data)
                              ->prefix).m_string + lVar11));
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 0x30;
    } while (lVar14 < (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos);
  }
  pTVar1->namespaceDeclarationsSize = this->lastNamespaceDeclaration;
  this->field_0x79 = this->field_0x79 | 2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003994a8:
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriterPrivate::writeStartElement(QAnyStringView namespaceUri, QAnyStringView name,
                                                StartElementOption option)
{
    if (!finishStartElement(false) && autoFormatting)
        indent(tagStack.size());

    Tag &tag = tagStack_push();
    tag.name = addToStringStorage(name);
    tag.namespaceDeclaration = findNamespace(namespaceUri);
    write("<");
    if (!tag.namespaceDeclaration.prefix.isEmpty()) {
        write(tag.namespaceDeclaration.prefix);
        write(":");
    }
    write(tag.name);
    inStartElement = lastWasStartElement = true;

    if (option != StartElementOption::OmitNamespaceDeclarations) {
        for (qsizetype i = lastNamespaceDeclaration; i < namespaceDeclarations.size(); ++i)
            writeNamespaceDeclaration(namespaceDeclarations[i]);
    }
    tag.namespaceDeclarationsSize = lastNamespaceDeclaration;
    didWriteAnyToken = true;
}